

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O1

ngram_model_t * ngram_model_set_interp(ngram_model_t *base,char **names,float32 *weights)

{
  char *__s1;
  long lVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (weights == (float32 *)0x0 || names == (char **)0x0) {
    if (weights != (float32 *)0x0) {
      memcpy(*(void **)&base[1].n,weights,(long)base[1].refcount << 2);
    }
  }
  else {
    uVar6 = base[1].refcount;
    uVar4 = (ulong)uVar6;
    bVar2 = 0 < (int)uVar6;
    if (0 < (int)uVar6) {
      uVar5 = 0;
      do {
        uVar6 = 0;
        if (0 < (int)(uint)uVar4) {
          __s1 = names[uVar5];
          lVar1 = *(long *)&base[1].n_1g_alloc;
          uVar7 = 0;
          do {
            iVar3 = strcmp(__s1,*(char **)(lVar1 + uVar7 * 8));
            uVar8 = uVar7;
            if (iVar3 == 0) break;
            uVar7 = uVar7 + 1;
            uVar8 = uVar4 & 0xffffffff;
          } while ((uVar4 & 0xffffffff) != uVar7);
          uVar6 = (uint)uVar8;
        }
        if (uVar6 == (uint)uVar4) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                  ,0x1fd,"Unknown LM name %s\n",names[uVar5 & 0xffffffff]);
          if (bVar2) {
            return (ngram_model_t *)0x0;
          }
          break;
        }
        iVar3 = logmath_log(base->lmath,(float64)(double)(float)weights[uVar5]);
        *(int *)(*(long *)&base[1].n + (ulong)uVar6 * 4) = iVar3;
        uVar5 = uVar5 + 1;
        uVar4 = (ulong)base[1].refcount;
        bVar2 = (long)uVar5 < (long)uVar4;
      } while ((long)uVar5 < (long)uVar4);
    }
  }
  *(undefined4 *)&base[1].field_0x4 = 0xffffffff;
  return base;
}

Assistant:

ngram_model_t *
ngram_model_set_interp(ngram_model_t * base,
                       const char **names, const float32 * weights)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;

    /* If we have a set of weights here, then set them. */
    if (names && weights) {
        int32 i, j;

        /* We hope there aren't many models. */
        for (i = 0; i < set->n_models; ++i) {
            for (j = 0; j < set->n_models; ++j)
                if (0 == strcmp(names[i], set->names[j]))
                    break;
            if (j == set->n_models) {
                E_ERROR("Unknown LM name %s\n", names[i]);
                return NULL;
            }
            set->lweights[j] = logmath_log(base->lmath, weights[i]);
        }
    }
    else if (weights) {
        memcpy(set->lweights, weights,
               set->n_models * sizeof(*set->lweights));
    }
    /* Otherwise just enable existing weights. */
    set->cur = -1;
    return base;
}